

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkAbstractNodes(Wlc_Ntk_t *p,Vec_Int_t *vNodesInit)

{
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *__ptr;
  long lVar5;
  int *piVar6;
  Wlc_Obj_t *pWVar7;
  Wlc_Ntk_t *pWVar8;
  int iVar9;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar10;
  ulong uVar11;
  ulong uVar12;
  
  __ptr = vNodesInit;
  if (vNodesInit == (Vec_Int_t *)0x0) {
    __ptr = Wlc_NtkCollectMultipliers(p);
    if (__ptr == (Vec_Int_t *)0x0) {
      return (Wlc_Ntk_t *)0x0;
    }
  }
  if (0 < __ptr->nSize) {
    lVar5 = 0;
    do {
      iVar4 = __ptr->pArray[lVar5];
      if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0037c08f;
      *(ushort *)(p->pObjs + iVar4) = *(ushort *)(p->pObjs + iVar4) | 0x80;
      lVar5 = lVar5 + 1;
    } while (lVar5 < __ptr->nSize);
  }
  uVar3 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar3) {
    piVar6 = (p->vCopies).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar3 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar3 << 2);
    }
    (p->vCopies).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset((p->vCopies).pArray,0,(ulong)uVar3 * 4);
  }
  (p->vCopies).nSize = uVar3;
  if (1 < p->iObj) {
    uVar12 = 1;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar12) {
LAB_0037c08f:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if (uVar12 == (uint)(p->vCopies).nSize) break;
      pWVar7 = p->pObjs + uVar12;
      uVar2 = *(ushort *)pWVar7;
      if ((char)uVar2 < '\0') {
        *(ushort *)pWVar7 = uVar2 & 0xff7f;
        iVar9 = pWVar7->End - pWVar7->Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        iVar4 = Wlc_ObjAlloc(p,1,uVar2 >> 6 & 1,iVar4,0);
      }
      else {
        uVar11 = (ulong)pWVar7->nFanins;
        if (0 < (int)pWVar7->nFanins) {
          paVar1 = &pWVar7->field_10;
          lVar5 = 0;
          do {
            if ((2 < (uint)uVar11) || (paVar10 = paVar1, (*(uint *)pWVar7 & 0x3f | 0x10) == 0x16)) {
              paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar1->pFanins[0];
            }
            iVar4 = paVar10->Fanins[lVar5];
            if (((long)iVar4 < 0) || ((p->vCopies).nSize <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if ((2 < (uint)uVar11) || (paVar10 = paVar1, (*(uint *)pWVar7 & 0x3f | 0x10) == 0x16)) {
              paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar1->pFanins[0];
            }
            paVar10->Fanins[lVar5] = (p->vCopies).pArray[iVar4];
            lVar5 = lVar5 + 1;
            uVar11 = (ulong)(int)pWVar7->nFanins;
          } while (lVar5 < (long)uVar11);
        }
        iVar4 = (int)uVar12;
      }
      if ((long)(p->vCopies).nSize <= (long)uVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[uVar12] = iVar4;
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)p->iObj);
  }
  if (__ptr != vNodesInit) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  pWVar8 = Wlc_NtkDupDfs(p,0,1);
  return pWVar8;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAbstractNodes( Wlc_Ntk_t * p, Vec_Int_t * vNodesInit )
{
    Vec_Int_t * vNodes = vNodesInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    // get multipliers if not given
    if ( vNodes == NULL )
        vNodes = Wlc_NtkCollectMultipliers( p );
    if ( vNodes == NULL )
        return NULL;
    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->Mark = 1;
    // iterate through the nodes in the DFS order
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == Vec_IntSize(&p->vCopies) )
            break;
        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            // add fresh PI with the same number of bits
            iObj = Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 );
        }
        else {
            // update fanins 
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }
    // POs do not change in this procedure
    if ( vNodes != vNodesInit )
        Vec_IntFree( vNodes );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p, 0, 1 );
    return pNew;
}